

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferBuilder.h
# Opt level: O0

uint32 __thiscall Js::BufferBuilderAligned::FixOffset(BufferBuilderAligned *this,uint32 offset)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  uint32 uVar4;
  undefined4 *puVar5;
  uint32 offset_local;
  BufferBuilderAligned *this_local;
  
  (this->super_BufferBuilder).offset = offset;
  uVar3 = ::Math::Align<unsigned_int>((this->super_BufferBuilder).offset,this->alignment);
  this->padding = uVar3 - (this->super_BufferBuilder).offset;
  if (this->alignment <= this->padding) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BufferBuilder.h"
                                ,0x151,"(this->padding < this->alignment)",
                                "this->padding < this->alignment");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  uVar4 = (**this->content->_vptr_BufferBuilder)(this->content,(ulong)uVar3);
  return uVar4;
}

Assistant:

uint32 FixOffset(uint32 offset) override
        {
            this->offset = offset;

            // Calculate padding
            offset = ::Math::Align(this->offset, this->alignment);
            this->padding = offset - this->offset;
            Assert(this->padding < this->alignment);

            return content->FixOffset(offset);
        }